

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_low_entropy_ref(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t uVar2;
  code *pcVar3;
  
  piVar1 = strm->state;
  if ((piVar1->ref != 0) && (uVar2 = copysample(strm), uVar2 == 0)) {
    return 0;
  }
  pcVar3 = m_zero_block;
  if (piVar1->id == 1) {
    pcVar3 = m_se;
  }
  piVar1->mode = pcVar3;
  return 1;
}

Assistant:

static int m_low_entropy_ref(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (state->ref && copysample(strm) == 0)
        return M_EXIT;

    if(state->id == 1) {
        state->mode = m_se;
        return M_CONTINUE;
    }

    state->mode = m_zero_block;
    return M_CONTINUE;
}